

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

string * __thiscall TrodesMsg::getformat_abi_cxx11_(TrodesMsg *this)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string TrodesMsg::getformat() const
{
    return format;
}